

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMapTestCase.cpp
# Opt level: O0

void __thiscall SuiteFieldMapTests::TestaddGroupPtr_nullptr::RunImpl(TestaddGroupPtr_nullptr *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_d8;
  int local_b4 [5];
  message_order local_a0;
  FieldMap local_80 [8];
  FieldMap fieldMap;
  TestaddGroupPtr_nullptr *this_local;
  
  FIX::message_order::message_order(&local_a0,normal);
  FIX::FieldMap::FieldMap(local_80,&local_a0);
  FIX::message_order::~message_order(&local_a0);
  FIX::FieldMap::addGroupPtr((int)local_80,(FieldMap *)0x1,false);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  local_b4[1] = 0;
  local_b4[0] = FIX::FieldMap::groupCount((int)local_80);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_d8,*ppTVar2,0x43);
  UnitTest::CheckEqual<int,int>(results,local_b4 + 1,local_b4,&local_d8);
  FIX::FieldMap::~FieldMap(local_80);
  return;
}

Assistant:

TEST(addGroupPtr_nullptr)
{
  FieldMap fieldMap;
  fieldMap.addGroupPtr(1, nullptr);
  CHECK_EQUAL(0, (int) fieldMap.groupCount(0));
}